

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

void google::protobuf::internal::WireFormat::SerializeFieldWithCachedSizes
               (FieldDescriptor *field,Message *message,CodedOutputStream *output)

{
  bool bVar1;
  undefined1 value;
  char cVar2;
  int iVar3;
  CppType CVar4;
  uint uVar5;
  Type TVar6;
  int32 iVar7;
  uint32 uVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar10;
  string *psVar11;
  uint64 uVar12;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  int64 value_00;
  undefined4 extraout_var_06;
  long lVar13;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  MessageLite *pMVar14;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  ulong uVar15;
  ulong uVar16;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float value_01;
  anon_union_8_2_947300a4 anon_var_0;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double value_02;
  vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> sorted_key_list;
  MapValueRef local_78;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  map_entries;
  Reflection *reflection;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_05;
  undefined4 extraout_var_07;
  undefined4 extraout_var_10;
  
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  reflection = (Reflection *)CONCAT44(extraout_var,iVar3);
  if ((((field[0x50] == (FieldDescriptor)0x1) &&
       (*(char *)(*(long *)(*(long *)(field + 0x58) + 0x20) + 0x68) == '\x01')) &&
      (CVar4 = FieldDescriptor::cpp_type(field), CVar4 == CPPTYPE_MESSAGE)) &&
     (*(int *)(field + 0x4c) != 3)) {
    SerializeMessageSetItemWithCachedSizes(field,message,output);
    return;
  }
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    iVar3 = (*reflection->_vptr_Reflection[0x5b])(reflection,message,field);
    bVar1 = MapFieldBase::IsMapValid((MapFieldBase *)CONCAT44(extraout_var_00,iVar3));
    if (bVar1) {
      uVar15 = io::CodedOutputStream::default_serialization_deterministic_;
      if (output->serialization_deterministic_is_overridden_ != false) {
        uVar15 = (ulong)output->serialization_deterministic_override_;
      }
      if (uVar15 != 0) {
        MapKeySorter::SortKey(&sorted_key_list,message,reflection,field);
        for (; sorted_key_list.
               super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               sorted_key_list.
               super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
               ._M_impl.super__Vector_impl_data._M_finish;
            sorted_key_list.
            super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 sorted_key_list.
                 super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1) {
          map_entries.
          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
          ._M_impl.super__Vector_impl_data._0_12_ = ZEXT812(0);
          (*reflection->_vptr_Reflection[0x56])
                    (reflection,message,field,
                     sorted_key_list.
                     super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                     ._M_impl.super__Vector_impl_data._M_start,(MapValueRef *)&map_entries);
          SerializeMapEntry(field,sorted_key_list.
                                  super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                            (MapValueRef *)&map_entries,output);
        }
        std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::~vector
                  (&sorted_key_list);
        return;
      }
      (*reflection->_vptr_Reflection[0x58])(&sorted_key_list,reflection,message,field);
      while( true ) {
        (*reflection->_vptr_Reflection[0x59])((MapIterator *)&map_entries,reflection,message,field);
        cVar2 = (**(code **)(((sorted_key_list.
                               super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                               ._M_impl.super__Vector_impl_data._M_finish)->val_).int64_value_ +
                            0x28))(sorted_key_list.
                                   super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,&sorted_key_list,
                                   (MapIterator *)&map_entries);
        MapIterator::~MapIterator((MapIterator *)&map_entries);
        if (cVar2 != '\0') break;
        SerializeMapEntry(field,(MapKey *)
                                &sorted_key_list.
                                 super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_78,output
                         );
        (**(code **)(((sorted_key_list.
                       super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->val_).int64_value_ + 0x78))
                  (sorted_key_list.
                   super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&sorted_key_list);
      }
      MapIterator::~MapIterator((MapIterator *)&sorted_key_list);
      return;
    }
  }
  if (*(int *)(field + 0x4c) == 3) {
    uVar5 = (*reflection->_vptr_Reflection[6])(reflection,message,field);
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((1 < (int)uVar5) && (bVar1 = FieldDescriptor::is_map(field), bVar1)) {
      uVar15 = io::CodedOutputStream::default_serialization_deterministic_;
      if (output->serialization_deterministic_is_overridden_ != false) {
        uVar15 = (ulong)output->serialization_deterministic_override_;
      }
      if (uVar15 != 0) {
        DynamicMapSorter::Sort
                  ((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                    *)&sorted_key_list,message,uVar5,reflection,field);
        std::
        vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ::_M_move_assign(&map_entries,
                         (_Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                          *)&sorted_key_list);
        std::
        _Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ::~_Vector_base((_Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                         *)&sorted_key_list);
      }
    }
  }
  else {
    if (*(char *)(*(long *)(*(long *)(field + 0x58) + 0x20) + 0x6b) == '\0') {
      uVar5 = (*reflection->_vptr_Reflection[5])(reflection,message,field);
      uVar5 = uVar5 & 0xff;
    }
    else {
      uVar5 = 1;
    }
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  bVar1 = FieldDescriptor::is_packed(field);
  if (bVar1 && 0 < (int)uVar5) {
    WireFormatLite::WriteTag(*(int *)(field + 0x38),WIRETYPE_LENGTH_DELIMITED,output);
    sVar10 = FieldDataOnlyByteSize(field,message);
    io::CodedOutputStream::WriteVarint32(output,(uint32)sVar10);
  }
  uVar16 = 0;
  uVar15 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar15 = uVar16;
  }
  do {
    if (uVar15 == uVar16) {
      std::
      _Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ::~_Vector_base(&map_entries.
                       super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                     );
      return;
    }
    TVar6 = FieldDescriptor::type(field);
    switch(TVar6) {
    case TYPE_DOUBLE:
      if (*(int *)(field + 0x4c) == 3) {
        (*reflection->_vptr_Reflection[0x2f])(reflection,message,field,uVar16 & 0xffffffff);
        value_02 = extraout_XMM0_Qa;
      }
      else {
        (*reflection->_vptr_Reflection[0x16])(reflection,message,field);
        value_02 = extraout_XMM0_Qa_00;
      }
      if (bVar1) {
        io::CodedOutputStream::WriteLittleEndian64(output,(uint64)value_02);
      }
      else {
        WireFormatLite::WriteDouble(*(int *)(field + 0x38),value_02,output);
      }
      break;
    case TYPE_FLOAT:
      if (*(int *)(field + 0x4c) == 3) {
        (*reflection->_vptr_Reflection[0x2e])(reflection,message,field,uVar16 & 0xffffffff);
        value_01 = extraout_XMM0_Da;
      }
      else {
        (*reflection->_vptr_Reflection[0x15])(reflection,message,field);
        value_01 = extraout_XMM0_Da_00;
      }
      if (bVar1) {
        io::CodedOutputStream::WriteLittleEndian32(output,(uint32)value_01);
      }
      else {
        WireFormatLite::WriteFloat(*(int *)(field + 0x38),value_01,output);
      }
      break;
    case TYPE_INT64:
      if (*(int *)(field + 0x4c) == 3) {
        iVar3 = (*reflection->_vptr_Reflection[0x2b])(reflection,message,field,uVar16 & 0xffffffff);
        uVar12 = CONCAT44(extraout_var_02,iVar3);
      }
      else {
        iVar3 = (*reflection->_vptr_Reflection[0x12])(reflection,message,field);
        uVar12 = CONCAT44(extraout_var_11,iVar3);
      }
      if (bVar1) {
        io::CodedOutputStream::WriteVarint64(output,uVar12);
      }
      else {
        WireFormatLite::WriteInt64(*(int *)(field + 0x38),uVar12,output);
      }
      break;
    case TYPE_UINT64:
      if (*(int *)(field + 0x4c) == 3) {
        iVar3 = (*reflection->_vptr_Reflection[0x2d])(reflection,message,field,uVar16 & 0xffffffff);
        uVar12 = CONCAT44(extraout_var_04,iVar3);
      }
      else {
        iVar3 = (*reflection->_vptr_Reflection[0x14])(reflection,message,field);
        uVar12 = CONCAT44(extraout_var_13,iVar3);
      }
      if (bVar1) {
        io::CodedOutputStream::WriteVarint64(output,uVar12);
      }
      else {
        WireFormatLite::WriteUInt64(*(int *)(field + 0x38),uVar12,output);
      }
      break;
    case TYPE_INT32:
      if (*(int *)(field + 0x4c) == 3) {
        iVar7 = (*reflection->_vptr_Reflection[0x2a])(reflection,message,field,uVar16 & 0xffffffff);
      }
      else {
        iVar7 = (*reflection->_vptr_Reflection[0x11])(reflection,message,field);
      }
      if (bVar1) {
        io::CodedOutputStream::WriteVarint32SignExtended(output,iVar7);
      }
      else {
        WireFormatLite::WriteInt32(*(int *)(field + 0x38),iVar7,output);
      }
      break;
    case TYPE_FIXED64:
      if (*(int *)(field + 0x4c) == 3) {
        iVar3 = (*reflection->_vptr_Reflection[0x2d])(reflection,message,field,uVar16 & 0xffffffff);
        uVar12 = CONCAT44(extraout_var_06,iVar3);
      }
      else {
        iVar3 = (*reflection->_vptr_Reflection[0x14])(reflection,message,field);
        uVar12 = CONCAT44(extraout_var_15,iVar3);
      }
      if (bVar1) {
        io::CodedOutputStream::WriteLittleEndian64(output,uVar12);
      }
      else {
        WireFormatLite::WriteFixed64(*(int *)(field + 0x38),uVar12,output);
      }
      break;
    case TYPE_FIXED32:
      if (*(int *)(field + 0x4c) == 3) {
        uVar8 = (*reflection->_vptr_Reflection[0x2c])(reflection,message,field,uVar16 & 0xffffffff);
      }
      else {
        uVar8 = (*reflection->_vptr_Reflection[0x13])(reflection,message,field);
      }
      if (bVar1) {
        io::CodedOutputStream::WriteLittleEndian32(output,uVar8);
      }
      else {
        WireFormatLite::WriteFixed32(*(int *)(field + 0x38),uVar8,output);
      }
      break;
    case TYPE_BOOL:
      if (*(int *)(field + 0x4c) == 3) {
        iVar3 = (*reflection->_vptr_Reflection[0x30])(reflection,message,field,uVar16 & 0xffffffff);
        value = (undefined1)iVar3;
      }
      else {
        iVar3 = (*reflection->_vptr_Reflection[0x17])(reflection,message,field);
        value = (undefined1)iVar3;
      }
      if (bVar1) {
        WireFormatLite::WriteBoolNoTag((bool)value,output);
      }
      else {
        WireFormatLite::WriteBool(*(int *)(field + 0x38),(bool)value,output);
      }
      break;
    case TYPE_STRING:
      sorted_key_list.
      super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)&sorted_key_list.
                     super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      sorted_key_list.
      super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      sorted_key_list.
      super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      if (*(int *)(field + 0x4c) == 3) {
        iVar3 = (*reflection->_vptr_Reflection[0x35])
                          (reflection,message,field,uVar16 & 0xffffffff,&sorted_key_list);
        psVar11 = (string *)CONCAT44(extraout_var_08,iVar3);
      }
      else {
        iVar3 = (*reflection->_vptr_Reflection[0x1c])(reflection,message,field,&sorted_key_list);
        psVar11 = (string *)CONCAT44(extraout_var_18,iVar3);
      }
      WireFormatLite::VerifyUtf8String
                ((psVar11->_M_dataplus)._M_p,(int)psVar11->_M_string_length,SERIALIZE,
                 (char *)**(undefined8 **)(field + 8));
      WireFormatLite::WriteString(*(int *)(field + 0x38),psVar11,output);
      goto LAB_00335089;
    case TYPE_GROUP:
      iVar3 = *(int *)(field + 0x38);
      if (*(int *)(field + 0x4c) == 3) {
        if (map_entries.
            super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            map_entries.
            super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar9 = (*reflection->_vptr_Reflection[0x34])
                            (reflection,message,field,uVar16 & 0xffffffff);
          pMVar14 = (MessageLite *)CONCAT44(extraout_var_19,iVar9);
        }
        else {
          pMVar14 = &map_entries.
                     super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16]->super_MessageLite;
        }
      }
      else {
        iVar9 = (*reflection->_vptr_Reflection[0x1b])(reflection,message,field,0);
        pMVar14 = (MessageLite *)CONCAT44(extraout_var_10,iVar9);
      }
      WireFormatLite::WriteGroup(iVar3,pMVar14,output);
      break;
    case TYPE_MESSAGE:
      iVar3 = *(int *)(field + 0x38);
      if (*(int *)(field + 0x4c) == 3) {
        if (map_entries.
            super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            map_entries.
            super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar9 = (*reflection->_vptr_Reflection[0x34])
                            (reflection,message,field,uVar16 & 0xffffffff);
          pMVar14 = (MessageLite *)CONCAT44(extraout_var_20,iVar9);
        }
        else {
          pMVar14 = &map_entries.
                     super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16]->super_MessageLite;
        }
      }
      else {
        iVar9 = (*reflection->_vptr_Reflection[0x1b])(reflection,message,field,0);
        pMVar14 = (MessageLite *)CONCAT44(extraout_var_17,iVar9);
      }
      WireFormatLite::WriteMessage(iVar3,pMVar14,output);
      break;
    case TYPE_BYTES:
      sorted_key_list.
      super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)&sorted_key_list.
                     super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      sorted_key_list.
      super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      sorted_key_list.
      super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      if (*(int *)(field + 0x4c) == 3) {
        iVar3 = (*reflection->_vptr_Reflection[0x35])
                          (reflection,message,field,uVar16 & 0xffffffff,&sorted_key_list);
        psVar11 = (string *)CONCAT44(extraout_var_01,iVar3);
      }
      else {
        iVar3 = (*reflection->_vptr_Reflection[0x1c])(reflection,message,field,&sorted_key_list);
        psVar11 = (string *)CONCAT44(extraout_var_09,iVar3);
      }
      WireFormatLite::WriteBytes(*(int *)(field + 0x38),psVar11,output);
LAB_00335089:
      std::__cxx11::string::~string((string *)&sorted_key_list);
      break;
    case TYPE_UINT32:
      if (*(int *)(field + 0x4c) == 3) {
        uVar8 = (*reflection->_vptr_Reflection[0x2c])(reflection,message,field,uVar16 & 0xffffffff);
      }
      else {
        uVar8 = (*reflection->_vptr_Reflection[0x13])(reflection,message,field);
      }
      if (bVar1) {
        io::CodedOutputStream::WriteVarint32(output,uVar8);
      }
      else {
        WireFormatLite::WriteUInt32(*(int *)(field + 0x38),uVar8,output);
      }
      break;
    case TYPE_ENUM:
      if (*(int *)(field + 0x4c) == 3) {
        iVar3 = (*reflection->_vptr_Reflection[0x32])(reflection,message,field,uVar16 & 0xffffffff);
        lVar13 = CONCAT44(extraout_var_07,iVar3);
      }
      else {
        iVar3 = (*reflection->_vptr_Reflection[0x19])(reflection,message,field);
        lVar13 = CONCAT44(extraout_var_16,iVar3);
      }
      if (bVar1) {
        io::CodedOutputStream::WriteVarint32SignExtended(output,*(int32 *)(lVar13 + 0x10));
      }
      else {
        WireFormatLite::WriteEnum(*(int *)(field + 0x38),*(int *)(lVar13 + 0x10),output);
      }
      break;
    case TYPE_SFIXED32:
      if (*(int *)(field + 0x4c) == 3) {
        uVar8 = (*reflection->_vptr_Reflection[0x2a])(reflection,message,field,uVar16 & 0xffffffff);
      }
      else {
        uVar8 = (*reflection->_vptr_Reflection[0x11])(reflection,message,field);
      }
      if (bVar1) {
        io::CodedOutputStream::WriteLittleEndian32(output,uVar8);
      }
      else {
        WireFormatLite::WriteSFixed32(*(int *)(field + 0x38),uVar8,output);
      }
      break;
    case TYPE_SFIXED64:
      if (*(int *)(field + 0x4c) == 3) {
        iVar3 = (*reflection->_vptr_Reflection[0x2b])(reflection,message,field,uVar16 & 0xffffffff);
        uVar12 = CONCAT44(extraout_var_03,iVar3);
      }
      else {
        iVar3 = (*reflection->_vptr_Reflection[0x12])(reflection,message,field);
        uVar12 = CONCAT44(extraout_var_12,iVar3);
      }
      if (bVar1) {
        io::CodedOutputStream::WriteLittleEndian64(output,uVar12);
      }
      else {
        WireFormatLite::WriteSFixed64(*(int *)(field + 0x38),uVar12,output);
      }
      break;
    case TYPE_SINT32:
      if (*(int *)(field + 0x4c) == 3) {
        iVar7 = (*reflection->_vptr_Reflection[0x2a])(reflection,message,field,uVar16 & 0xffffffff);
      }
      else {
        iVar7 = (*reflection->_vptr_Reflection[0x11])(reflection,message,field);
      }
      if (bVar1) {
        WireFormatLite::WriteSInt32NoTag(iVar7,output);
      }
      else {
        WireFormatLite::WriteSInt32(*(int *)(field + 0x38),iVar7,output);
      }
      break;
    case MAX_TYPE:
      if (*(int *)(field + 0x4c) == 3) {
        iVar3 = (*reflection->_vptr_Reflection[0x2b])(reflection,message,field,uVar16 & 0xffffffff);
        value_00 = CONCAT44(extraout_var_05,iVar3);
      }
      else {
        iVar3 = (*reflection->_vptr_Reflection[0x12])(reflection,message,field);
        value_00 = CONCAT44(extraout_var_14,iVar3);
      }
      if (bVar1) {
        WireFormatLite::WriteSInt64NoTag(value_00,output);
      }
      else {
        WireFormatLite::WriteSInt64(*(int *)(field + 0x38),value_00,output);
      }
    }
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

void WireFormat::SerializeFieldWithCachedSizes(
    const FieldDescriptor* field,
    const Message& message,
    io::CodedOutputStream* output) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    SerializeMessageSetItemWithCachedSizes(field, message, output);
    return;
  }

  // For map fields, we can use either repeated field reflection or map
  // reflection.  Our choice has some subtle effects.  If we use repeated field
  // reflection here, then the repeated field representation becomes
  // authoritative for this field: any existing references that came from map
  // reflection remain valid for reading, but mutations to them are lost and
  // will be overwritten next time we call map reflection!
  //
  // So far this mainly affects Python, which keeps long-term references to map
  // values around, and always uses map reflection.  See: b/35918691
  //
  // Here we choose to use map reflection API as long as the internal
  // map is valid. In this way, the serialization doesn't change map field's
  // internal state and existing references that came from map reflection remain
  // valid for both reading and writing.
  if (field->is_map()) {
    MapFieldBase* map_field =
        message_reflection->MapData(const_cast<Message*>(&message), field);
    if (map_field->IsMapValid()) {
      if (output->IsSerializationDeterministic()) {
        std::vector<MapKey> sorted_key_list =
            MapKeySorter::SortKey(message, message_reflection, field);
        for (std::vector<MapKey>::iterator it = sorted_key_list.begin();
             it != sorted_key_list.end(); ++it) {
          MapValueRef map_value;
          message_reflection->InsertOrLookupMapValue(
              const_cast<Message*>(&message), field, *it, &map_value);
          SerializeMapEntry(field, *it, map_value, output);
        }
      } else {
        for (MapIterator it = message_reflection->MapBegin(
                 const_cast<Message*>(&message), field);
             it !=
             message_reflection->MapEnd(const_cast<Message*>(&message), field);
             ++it) {
          SerializeMapEntry(field, it.GetKey(), it.GetValueRef(), output);
        }
      }

      return;
    }
  }

  int count = 0;

  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  // map_entries is for maps that'll be deterministically serialized.
  std::vector<const Message*> map_entries;
  if (count > 1 && field->is_map() && output->IsSerializationDeterministic()) {
    map_entries =
        DynamicMapSorter::Sort(message, count, message_reflection, field);
  }

  const bool is_packed = field->is_packed();
  if (is_packed && count > 0) {
    WireFormatLite::WriteTag(field->number(),
        WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    const size_t data_size = FieldDataOnlyByteSize(field, message);
    output->WriteVarint32(data_size);
  }

  for (int j = 0; j < count; j++) {
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
      case FieldDescriptor::TYPE_##TYPE: {                                     \
        const CPPTYPE value = field->is_repeated() ?                           \
                              message_reflection->GetRepeated##CPPTYPE_METHOD( \
                                message, field, j) :                           \
                              message_reflection->Get##CPPTYPE_METHOD(         \
                                message, field);                               \
        if (is_packed) {                                                       \
          WireFormatLite::Write##TYPE_METHOD##NoTag(value, output);            \
        } else {                                                               \
          WireFormatLite::Write##TYPE_METHOD(field->number(), value, output);  \
        }                                                                      \
        break;                                                                 \
      }

      HANDLE_PRIMITIVE_TYPE( INT32,  int32,  Int32,  Int32)
      HANDLE_PRIMITIVE_TYPE( INT64,  int64,  Int64,  Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32,  int32, SInt32,  Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64,  int64, SInt64,  Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64, UInt64, UInt64)

      HANDLE_PRIMITIVE_TYPE( FIXED32, uint32,  Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE( FIXED64, uint64,  Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32,  int32, SFixed32,  Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64,  int64, SFixed64,  Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT , float , Float , Float )
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE

#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                      \
      case FieldDescriptor::TYPE_##TYPE:                                    \
        WireFormatLite::Write##TYPE_METHOD(                                 \
              field->number(),                                              \
              field->is_repeated() ?                                        \
                (map_entries.empty() ?                                      \
                     message_reflection->GetRepeated##CPPTYPE_METHOD(       \
                                     message, field, j) :                   \
                     *map_entries[j]) :                                     \
                message_reflection->Get##CPPTYPE_METHOD(message, field),    \
              output);                                                      \
        break;

      HANDLE_TYPE(GROUP  , Group  , Message)
      HANDLE_TYPE(MESSAGE, Message, Message)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        const EnumValueDescriptor* value = field->is_repeated() ?
          message_reflection->GetRepeatedEnum(message, field, j) :
          message_reflection->GetEnum(message, field);
        if (is_packed) {
          WireFormatLite::WriteEnumNoTag(value->number(), output);
        } else {
          WireFormatLite::WriteEnum(field->number(), value->number(), output);
        }
        break;
      }

      // Handle strings separately so that we can get string references
      // instead of copying.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = StrictUtf8Check(field);
        string scratch;
        const string& value = field->is_repeated() ?
          message_reflection->GetRepeatedStringReference(
            message, field, j, &scratch) :
          message_reflection->GetStringReference(message, field, &scratch);
        if (strict_utf8_check) {
          WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                           WireFormatLite::SERIALIZE,
                                           field->full_name().c_str());
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), SERIALIZE,
                                     field->full_name().c_str());
        }
        WireFormatLite::WriteString(field->number(), value, output);
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        string scratch;
        const string& value = field->is_repeated() ?
          message_reflection->GetRepeatedStringReference(
            message, field, j, &scratch) :
          message_reflection->GetStringReference(message, field, &scratch);
        WireFormatLite::WriteBytes(field->number(), value, output);
        break;
      }
    }
  }
}